

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_samplerparameterfv
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  bool bVar1;
  NotSupportedError *this_00;
  allocator<char> local_71;
  string local_70;
  GLuint local_4c;
  GLfloat local_48;
  GLuint sampler;
  float params [1];
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_EXT_texture_sRGB_decode",&local_31);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_48 = 9729.0;
    local_4c = 0x1234;
    glu::CallLogWrapper::glGenSamplers(&local_10->super_CallLogWrapper,1,&local_4c);
    this = local_10;
    local_48 = -1.0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
               ,&local_71);
    NegativeTestContext::beginSection(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    glu::CallLogWrapper::glSamplerParameterfv
              (&local_10->super_CallLogWrapper,local_4c,0x8a48,&local_48);
    NegativeTestContext::expectError(local_10,0x500);
    NegativeTestContext::endSection(local_10);
    glu::CallLogWrapper::glDeleteSamplers(&local_10->super_CallLogWrapper,1,&local_4c);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0xa04);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void srgb_decode_samplerparameterfv (NegativeTestContext& ctx)
{
	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	float	params[1]	= { GL_LINEAR };
	GLuint	sampler		= 0x1234;

	ctx.glGenSamplers(1, &sampler);

	params[0] = -1.0f;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glSamplerParameterfv(sampler, GL_TEXTURE_SRGB_DECODE_EXT, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}